

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O0

int checkBufYUV(uchar *buf,int w,int h,int subsamp,tjscalingfactor sf)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  uchar v;
  uchar u;
  uchar y;
  int blocksize;
  int halfway;
  int retval;
  int uvpitch;
  int ypitch;
  int ch;
  int cw;
  int ph;
  int pw;
  int vsf;
  int hsf;
  int col;
  int row;
  int local_48;
  uint local_24;
  uint local_20;
  int local_8;
  int iStack_4;
  
  iVar3 = tjMCUWidth[in_ECX] / 8;
  iVar4 = tjMCUHeight[in_ECX] / 8;
  uVar5 = (in_ESI + iVar3) - 1U & (iVar3 - 1U ^ 0xffffffff);
  uVar6 = (in_EDX + iVar4) - 1U & (iVar4 - 1U ^ 0xffffffff);
  iVar7 = (int)uVar5 / iVar3;
  iVar8 = (int)uVar6 / iVar4;
  uVar9 = (uVar5 + pad) - 1 & (pad - 1U ^ 0xffffffff);
  uVar10 = (iVar7 + pad) - 1U & (pad - 1U ^ 0xffffffff);
  local_48 = 1;
  local_8 = (int)in_R8;
  iStack_4 = (int)((ulong)in_R8 >> 0x20);
  iVar11 = (local_8 << 4) / iStack_4;
  iVar12 = (local_8 << 3) / iStack_4;
  local_20 = 0;
  do {
    if ((int)uVar6 <= (int)local_20) {
      if (in_ECX != 3) {
        for (local_20 = 0; (int)local_20 < iVar8; local_20 = local_20 + 1) {
          for (local_24 = 0; (int)local_24 < iVar7; local_24 = local_24 + 1) {
            bVar1 = *(byte *)(in_RDI + (int)(uVar9 * uVar6 + uVar10 * local_20 + local_24));
            bVar2 = *(byte *)(in_RDI + (int)(uVar9 * uVar6 + uVar10 * iVar8 +
                                            uVar10 * local_20 + local_24));
            if (((int)(local_20 * iVar4) / iVar12 + (int)(local_24 * iVar3) / iVar12) % 2 == 0) {
              if ((bVar1 < 0x7f) || (0x81 < bVar1)) {
                printf("\nComp. %s at %d,%d should be %d, not %d\n","u",(ulong)local_20,
                       (ulong)local_24,0x80,(ulong)bVar1);
                local_48 = 0;
                exitStatus = -1;
                goto LAB_0010979e;
              }
              if ((bVar2 < 0x7f) || (0x81 < bVar2)) {
                printf("\nComp. %s at %d,%d should be %d, not %d\n","v",(ulong)local_20,
                       (ulong)local_24,0x80,(ulong)bVar2);
                local_48 = 0;
                exitStatus = -1;
                goto LAB_0010979e;
              }
            }
            else if ((int)local_20 < ((int)(0x10 / (long)iVar4) * local_8) / iStack_4) {
              if ((bVar1 < 0x54) || (0x56 < bVar1)) {
                printf("\nComp. %s at %d,%d should be %d, not %d\n","u",(ulong)local_20,
                       (ulong)local_24,0x55,(ulong)bVar1);
                local_48 = 0;
                exitStatus = -1;
                goto LAB_0010979e;
              }
              if (bVar2 < 0xfe) {
                printf("\nComp. %s at %d,%d should be 255, not %d\n","v",(ulong)local_20,
                       (ulong)local_24,(ulong)bVar2);
                local_48 = 0;
                exitStatus = -1;
                goto LAB_0010979e;
              }
            }
            else {
              if (1 < bVar1) {
                printf("\nComp. %s at %d,%d should be 0, not %d\n","u",(ulong)local_20,
                       (ulong)local_24,(ulong)bVar1);
                local_48 = 0;
                exitStatus = -1;
                goto LAB_0010979e;
              }
              if ((bVar2 < 0x94) || (0x96 < bVar2)) {
                printf("\nComp. %s at %d,%d should be %d, not %d\n","v",(ulong)local_20,
                       (ulong)local_24,0x95,(ulong)bVar2);
                local_48 = 0;
                exitStatus = -1;
                goto LAB_0010979e;
              }
            }
          }
        }
      }
LAB_0010979e:
      if (local_48 == 0) {
        for (local_20 = 0; (int)local_20 < (int)uVar6; local_20 = local_20 + 1) {
          for (local_24 = 0; (int)local_24 < (int)uVar5; local_24 = local_24 + 1) {
            printf("%.3d ",(ulong)*(byte *)(in_RDI + (int)(uVar9 * local_20 + local_24)));
          }
          printf("\n");
        }
        printf("\n");
        for (local_20 = 0; (int)local_20 < iVar8; local_20 = local_20 + 1) {
          for (local_24 = 0; (int)local_24 < iVar7; local_24 = local_24 + 1) {
            printf("%.3d ",(ulong)*(byte *)(in_RDI + (int)(uVar9 * uVar6 +
                                                          uVar10 * local_20 + local_24)));
          }
          printf("\n");
        }
        printf("\n");
        for (local_20 = 0; (int)local_20 < iVar8; local_20 = local_20 + 1) {
          for (local_24 = 0; (int)local_24 < iVar7; local_24 = local_24 + 1) {
            printf("%.3d ",(ulong)*(byte *)(in_RDI + (int)(uVar9 * uVar6 + uVar10 * iVar8 +
                                                          uVar10 * local_20 + local_24)));
          }
          printf("\n");
        }
      }
      return local_48;
    }
    for (local_24 = 0; (int)local_24 < (int)uVar5; local_24 = local_24 + 1) {
      bVar1 = *(byte *)(in_RDI + (int)(uVar9 * local_20 + local_24));
      if (((int)local_20 / iVar12 + (int)local_24 / iVar12) % 2 == 0) {
        if ((int)local_20 < iVar11) {
          if (bVar1 < 0xfe) {
            printf("\nComp. %s at %d,%d should be 255, not %d\n","y",(ulong)local_20,(ulong)local_24
                   ,(ulong)bVar1);
            local_48 = 0;
            exitStatus = -1;
            goto LAB_0010979e;
          }
        }
        else if (1 < bVar1) {
          printf("\nComp. %s at %d,%d should be 0, not %d\n","y",(ulong)local_20,(ulong)local_24,
                 (ulong)bVar1);
          local_48 = 0;
          exitStatus = -1;
          goto LAB_0010979e;
        }
      }
      else if ((int)local_20 < iVar11) {
        if ((bVar1 < 0x4b) || (0x4d < bVar1)) {
          printf("\nComp. %s at %d,%d should be %d, not %d\n","y",(ulong)local_20,(ulong)local_24,
                 0x4c,(ulong)bVar1);
          local_48 = 0;
          exitStatus = -1;
          goto LAB_0010979e;
        }
      }
      else if ((bVar1 < 0xe1) || (0xe3 < bVar1)) {
        printf("\nComp. %s at %d,%d should be %d, not %d\n","y",(ulong)local_20,(ulong)local_24,0xe2
               ,(ulong)bVar1);
        local_48 = 0;
        exitStatus = -1;
        goto LAB_0010979e;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static int checkBufYUV(unsigned char *buf, int w, int h, int subsamp,
                       tjscalingfactor sf)
{
  int row, col;
  int hsf = tjMCUWidth[subsamp] / 8, vsf = tjMCUHeight[subsamp] / 8;
  int pw = PAD(w, hsf), ph = PAD(h, vsf);
  int cw = pw / hsf, ch = ph / vsf;
  int ypitch = PAD(pw, pad), uvpitch = PAD(cw, pad);
  int retval = 1;
  int halfway = 16 * sf.num / sf.denom;
  int blocksize = 8 * sf.num / sf.denom;

  for (row = 0; row < ph; row++) {
    for (col = 0; col < pw; col++) {
      unsigned char y = buf[ypitch * row + col];

      if (((row / blocksize) + (col / blocksize)) % 2 == 0) {
        if (row < halfway) CHECKVAL255(y)
        else CHECKVAL0(y);
      } else {
        if (row < halfway) CHECKVAL(y, 76)
        else CHECKVAL(y, 226);
      }
    }
  }
  if (subsamp != TJSAMP_GRAY) {
    halfway = 16 / vsf * sf.num / sf.denom;

    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++) {
        unsigned char u = buf[ypitch * ph + (uvpitch * row + col)],
          v = buf[ypitch * ph + uvpitch * ch + (uvpitch * row + col)];

        if (((row * vsf / blocksize) + (col * hsf / blocksize)) % 2 == 0) {
          CHECKVAL(u, 128);  CHECKVAL(v, 128);
        } else {
          if (row < halfway) {
            CHECKVAL(u, 85);  CHECKVAL255(v);
          } else {
            CHECKVAL0(u);  CHECKVAL(v, 149);
          }
        }
      }
    }
  }

bailout:
  if (retval == 0) {
    for (row = 0; row < ph; row++) {
      for (col = 0; col < pw; col++)
        printf("%.3d ", buf[ypitch * row + col]);
      printf("\n");
    }
    printf("\n");
    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++)
        printf("%.3d ", buf[ypitch * ph + (uvpitch * row + col)]);
      printf("\n");
    }
    printf("\n");
    for (row = 0; row < ch; row++) {
      for (col = 0; col < cw; col++)
        printf("%.3d ",
               buf[ypitch * ph + uvpitch * ch + (uvpitch * row + col)]);
      printf("\n");
    }
  }

  return retval;
}